

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

int InternStrnicmp(char *s1,char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  if (s2 == (char *)0x0) {
    return 1;
  }
  if (n != 0) {
    lVar5 = n - 1;
    do {
      bVar1 = *s1;
      if (bVar1 == 0) {
        iVar3 = -1;
      }
      else {
        bVar2 = *s2;
        if (bVar2 == 0) {
          iVar3 = 1;
        }
        else {
          iVar3 = bVar1 + 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            iVar3 = (int)(char)bVar1;
          }
          iVar4 = bVar2 + 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            iVar4 = (int)(char)bVar2;
          }
          iVar3 = iVar3 - iVar4;
          s1 = (char *)((byte *)s1 + 1);
          s2 = (char *)((byte *)s2 + 1);
        }
      }
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while ((bVar6) && (iVar3 == 0));
    return iVar3;
  }
  return 0;
}

Assistant:

static int InternStrnicmp(const char* s1, const char* s2, size_t n)
{
    int result;

    if (s1 == NULL)
    {
        result = -1;
    }
    else if (s2 == NULL)
    {
        result = 1;
    }
    else
    {
        result = 0;

        while (n-- && result == 0)
        {
            if (*s1 == 0) result = -1;
            else if (*s2 == 0) result = 1;
            else
            {

                result = TOLOWER(*s1) - TOLOWER(*s2);
                ++s1;
                ++s2;
            }
        }
    }
    return result;
}